

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O0

void internal_cod_submit_general
               (cod_exec_context ec,int port,void *data,void *type_info,attr_list attrs,timeval *tp)

{
  int iVar1;
  __pid_t _Var2;
  pthread_t pVar3;
  uint *puVar4;
  attr_list p_Var5;
  CManager_conflict cm_00;
  CMTaskHandle __ptr;
  void *in_RDX;
  uint in_ESI;
  undefined8 in_RDI;
  undefined8 in_R8;
  long in_R9;
  delayed_event *ev_1;
  CMTaskHandle handle;
  timespec ts_1;
  FMFormat event_format;
  delayed_event *ev;
  timespec ts;
  EVstone target_stone;
  event_item *event;
  event_path_data evp;
  CManager cm;
  ev_state_data *ev_state;
  FILE *in_stack_ffffffffffffff48;
  CManager_conflict in_stack_ffffffffffffff50;
  FILE *in_stack_ffffffffffffff58;
  CManager_conflict in_stack_ffffffffffffff60;
  CManager_conflict in_stack_ffffffffffffff68;
  timespec local_88;
  undefined8 in_stack_ffffffffffffff88;
  CMTraceType trace_type;
  event_item *event_00;
  CManager in_stack_ffffffffffffff90;
  timespec local_68;
  uint local_54;
  event_item *local_50;
  undefined8 local_48;
  CManager local_40;
  long *local_38;
  long local_30;
  undefined8 local_28;
  void *local_18;
  uint local_c;
  
  trace_type = (CMTraceType)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  local_30 = in_R9;
  local_28 = in_R8;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_38 = (long *)cod_get_client_data(in_RDI,0x34567890);
  local_40 = (CManager)*local_38;
  local_48 = *(undefined8 *)(*local_38 + 0x118);
  local_54 = port_to_stone((ev_state_data *)in_stack_ffffffffffffff48,0);
  if (local_54 == 0xffffffff) {
    printf("Port %d on stone %d invalid\n",(ulong)local_c,(ulong)*(uint *)(local_38 + 2));
  }
  else {
    iVar1 = CManager_locked(local_40);
    if (iVar1 == 0) {
      __assert_fail("CManager_locked(cm)",
                    "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/response.c"
                    ,0x65f,
                    "void internal_cod_submit_general(cod_exec_context, int, void *, void *, attr_list, struct timeval *)"
                   );
    }
    *(int *)(local_38 + 8) = (int)local_38[8] + 1;
    if ((local_38[1] == 0) || (local_18 != *(void **)(local_38[1] + 0x20))) {
      event_00 = (event_item *)0x0;
      iVar1 = CMtrace_val[10];
      if (local_40->CMTrace_file == (FILE *)0x0) {
        iVar1 = CMtrace_init(in_stack_ffffffffffffff90,CMAlwaysTrace);
      }
      if (iVar1 != 0) {
        if (CMtrace_PID != 0) {
          in_stack_ffffffffffffff48 = (FILE *)local_40->CMTrace_file;
          _Var2 = getpid();
          in_stack_ffffffffffffff50 = (CManager_conflict)(long)_Var2;
          pVar3 = pthread_self();
          fprintf(in_stack_ffffffffffffff48,"P%lxT%lx - ",in_stack_ffffffffffffff50,pVar3);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_88);
          fprintf((FILE *)local_40->CMTrace_file,"%lld.%.9ld - ",local_88.tv_sec,local_88.tv_nsec);
        }
        fprintf((FILE *)local_40->CMTrace_file,
                "Internal COD submit, submission of new data to stone %d\n",(ulong)local_54);
      }
      fflush((FILE *)local_40->CMTrace_file);
      if ((event_00 == (event_item *)0x0) &&
         (event_00 = (event_item *)
                     EVregister_format_set
                               (in_stack_ffffffffffffff50,
                                (FMStructDescList)in_stack_ffffffffffffff48),
         event_00 == (event_item *)0x0)) {
        printf("Bad format information on submit\n");
      }
      else {
        local_50 = get_free_event((event_path_data)in_stack_ffffffffffffff50);
        local_50->event_encoded = 0;
        local_50->decoded_event = local_18;
        local_50->reference_format = (FMFormat)event_00;
        local_50->format = (CMFormat)0x0;
        local_50->free_func = (EVFreeFunction)0x0;
        local_50->free_arg = local_50;
        p_Var5 = (attr_list)add_ref_attr_list(local_28);
        local_50->attrs = p_Var5;
        local_50->cm = local_40;
        cod_encode_event(in_stack_ffffffffffffff50,(event_item *)in_stack_ffffffffffffff48);
        local_50->event_encoded = 1;
        local_50->decoded_event = (void *)0x0;
        if (local_30 == 0) {
          internal_path_submit
                    (in_stack_ffffffffffffff60,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                     (event_item *)in_stack_ffffffffffffff50);
          return_event((event_path_data)in_stack_ffffffffffffff90,event_00);
        }
        else {
          cm_00 = (CManager_conflict)INT_CMmalloc((size_t)in_stack_ffffffffffffff50);
          *(uint *)&cm_00->transports = local_54;
          *(event_item **)&cm_00->initialized = local_50;
          __ptr = INT_CMadd_delayed_task
                            (cm_00,(int)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                             (int)in_stack_ffffffffffffff60,(CMPollFunc)in_stack_ffffffffffffff58,
                             in_stack_ffffffffffffff50);
          free(__ptr);
        }
      }
    }
    else {
      iVar1 = CMtrace_val[10];
      if (local_40->CMTrace_file == (FILE *)0x0) {
        iVar1 = CMtrace_init(in_stack_ffffffffffffff90,trace_type);
      }
      if (iVar1 != 0) {
        if (CMtrace_PID != 0) {
          in_stack_ffffffffffffff58 = (FILE *)local_40->CMTrace_file;
          _Var2 = getpid();
          in_stack_ffffffffffffff60 = (CManager_conflict)(long)_Var2;
          pVar3 = pthread_self();
          fprintf(in_stack_ffffffffffffff58,"P%lxT%lx - ",in_stack_ffffffffffffff60,pVar3);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_68);
          fprintf((FILE *)local_40->CMTrace_file,"%lld.%.9ld - ",local_68.tv_sec,local_68.tv_nsec);
        }
        fprintf((FILE *)local_40->CMTrace_file,
                "Internal COD submit, resubmission of current input event to stone %d\n",
                (ulong)local_54);
      }
      fflush((FILE *)local_40->CMTrace_file);
      if (local_30 == 0) {
        internal_path_submit
                  (in_stack_ffffffffffffff60,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                   (event_item *)in_stack_ffffffffffffff50);
      }
      else {
        puVar4 = (uint *)INT_CMmalloc((size_t)in_stack_ffffffffffffff50);
        *puVar4 = local_54;
        *(long *)(puVar4 + 2) = local_38[1];
        *(int *)local_38[1] = *(int *)local_38[1] + 1;
        INT_CMadd_delayed_task
                  (in_stack_ffffffffffffff68,(int)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                   (int)in_stack_ffffffffffffff60,(CMPollFunc)in_stack_ffffffffffffff58,
                   in_stack_ffffffffffffff50);
      }
    }
  }
  return;
}

Assistant:

static void
internal_cod_submit_general(cod_exec_context ec, int port, void *data, void *type_info, attr_list attrs, struct timeval *tp)
{
    struct ev_state_data *ev_state = (void*)cod_get_client_data(ec, 0x34567890);
    CManager cm = ev_state->cm;
    event_path_data evp = ev_state->cm->evp;
    event_item *event;
    EVstone target_stone = port_to_stone(ev_state, port);

    if (target_stone == -1) {
        printf("Port %d on stone %d invalid\n", port, ev_state->stone);
	return;
    }

    assert(CManager_locked(cm));
    ev_state->did_output++;
    if (ev_state->cur_event && data == ev_state->cur_event->decoded_event) {
	CMtrace_out(cm, EVerbose,
		    "Internal COD submit, resubmission of current input event to stone %d\n",
		    target_stone);
	if (tp) {
	    /* delayed event */
	    struct delayed_event *ev = malloc(sizeof(struct delayed_event));
	    ev->to_stone = target_stone;
	    ev->event = ev_state->cur_event;
	    ev_state->cur_event->ref_count++;
	    INT_CMadd_delayed_task(cm, tp->tv_sec, tp->tv_usec, EVdelayed_submit_func, (void*)ev);
	} else {
	    internal_path_submit(ev_state->cm, target_stone, ev_state->cur_event);
	}
    } else {
	FMFormat event_format = NULL;
	CMtrace_out(cm, EVerbose,
		    "Internal COD submit, submission of new data to stone %d\n",
		    target_stone);
	if (event_format == NULL) {
	    event_format = EVregister_format_set(cm, (FMStructDescList) type_info);
	    if (event_format == NULL) {
		printf("Bad format information on submit\n");
		return;
	    }
	}
	event = get_free_event(evp);
	event->event_encoded = 0;
	event->decoded_event = data;
	event->reference_format = event_format;
	event->format = NULL;
/*	event->free_func = cod_free_wrapper;*/
	event->free_func = NULL;
	event->free_arg = event;
	event->attrs = add_ref_attr_list(attrs);
	event->cm = cm;
	cod_encode_event(cm, event);  /* map to memory we trust */
	event->event_encoded = 1;
	event->decoded_event = NULL;  /* lose old data */
	if (tp) {
	    /* delayed event */
	    struct delayed_event {
		EVstone to_stone;
		event_item *event;
	    };
	    CMTaskHandle handle;
	    struct delayed_event *ev = malloc(sizeof(struct delayed_event));
	    ev->to_stone = target_stone;
	    ev->event = event;
	    handle = INT_CMadd_delayed_task(cm, tp->tv_sec, tp->tv_usec, EVdelayed_submit_func, (void*)ev);
	    free(handle);
	} else {
	    internal_path_submit(cm, target_stone, event);
	    return_event(cm->evp, event);
	}
    }
}